

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O0

void split_parse_frame(SplitContext_t_conflict *ctx,RK_U8 *buf,RK_S32 size)

{
  void *pvVar1;
  VP9ParseContext *s;
  RK_S32 size_local;
  RK_U8 *buf_local;
  SplitContext_t_conflict *ctx_local;
  
  pvVar1 = ctx->priv_data;
  if ((*buf & 4) == 0) {
    ctx->key_frame = 1;
  }
  else {
    ctx->key_frame = 0;
  }
  if ((*buf & 2) == 0) {
    *(RK_S64 *)((long)pvVar1 + 0x28) = ctx->pts;
    ctx->pts = -1;
  }
  else {
    if (ctx->pts == -1) {
      ctx->pts = *(RK_S64 *)((long)pvVar1 + 0x28);
    }
    *(undefined8 *)((long)pvVar1 + 0x28) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

static void split_parse_frame(SplitContext_t *ctx, RK_U8 *buf, RK_S32 size)
{
    VP9ParseContext *s = (VP9ParseContext *)ctx->priv_data;

    if (buf[0] & 0x4) {
        ctx->key_frame = 0;
    } else {
        ctx->key_frame = 1;
    }

    if (buf[0] & 0x2) {
        if (ctx->pts == -1)
            ctx->pts = s->pts;
        s->pts = -1;
    } else {
        s->pts = ctx->pts;
        ctx->pts = -1;
    }

    (void)size;
}